

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

ON__UINT64 __thiscall
ON_3DM_BIG_CHUNK::LengthRemaining(ON_3DM_BIG_CHUNK *this,ON__UINT64 current_position)

{
  ON__UINT64 current_position_local;
  ON_3DM_BIG_CHUNK *this_local;
  
  if ((((this->m_typecode & 0x80000000) == 0) && (this->m_start_offset <= current_position)) &&
     (current_position <= this->m_end_offset)) {
    this_local = (ON_3DM_BIG_CHUNK *)(this->m_end_offset - current_position);
  }
  else {
    this_local = (ON_3DM_BIG_CHUNK *)0x0;
  }
  return (ON__UINT64)this_local;
}

Assistant:

ON__UINT64 ON_3DM_BIG_CHUNK::LengthRemaining(
  ON__UINT64 current_position
) const
{
  if (0 == (TCODE_SHORT & m_typecode)
    && m_start_offset <= current_position
    && current_position <= m_end_offset)
  {
    return (m_end_offset - current_position);
  }

  return 0;
}